

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

optional<OutputType> __thiscall
anon_unknown.dwarf_2a6a20::SHDescriptor::GetOutputType(SHDescriptor *this)

{
  long lVar1;
  pointer puVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (this->super_DescriptorImpl).m_subdescriptor_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->super_DescriptorImpl).m_subdescriptor_args.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 != 8) {
    __assert_fail("m_subdescriptor_args.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x445,
                  "virtual std::optional<OutputType> (anonymous namespace)::SHDescriptor::GetOutputType() const"
                 );
  }
  uVar3 = (**(code **)(*(long *)(puVar2->_M_t).
                                super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                ._M_t + 0x58))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<OutputType>)((ulong)((uVar3 & 0x1ffffffff) == 0x100000002) | 0x100000000);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<OutputType> GetOutputType() const override
    {
        assert(m_subdescriptor_args.size() == 1);
        if (IsSegwit()) return OutputType::P2SH_SEGWIT;
        return OutputType::LEGACY;
    }